

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O3

int pt_time_update_tma(pt_time *time,pt_packet_tma *packet,pt_config *config)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = -1;
  if (config != (pt_config *)0x0 && (packet != (pt_packet_tma *)0x0 && time != (pt_time *)0x0)) {
    bVar1 = time->field_0x29;
    iVar5 = -6;
    if (((bVar1 & 5) == 1) && (iVar5 = -1, (bVar1 & 8) == 0)) {
      uVar3 = packet->ctc;
      bVar2 = config->mtc_freq;
      uVar4 = packet->fc;
      time->field_0x29 = bVar1 | 4;
      time->base = time->base - (ulong)uVar4;
      time->fc = time->fc + (ulong)uVar4;
      if (bVar2 < 9) {
        time->field_0x29 = bVar1 | 0xc;
      }
      uVar6 = (0x100 << (bVar2 & 0x1f)) + 0xffffU & (uint)uVar3;
      time->ctc_cyc = uVar6;
      time->ctc = uVar6;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int pt_time_update_tma(struct pt_time *time,
		       const struct pt_packet_tma *packet,
		       const struct pt_config *config)
{
	uint32_t ctc, mtc_freq, mtc_hi, ctc_mask;
	uint64_t fc;

	if (!time || !packet || !config)
		return -pte_internal;

	/* Without a TSC something is seriously wrong. */
	if (!time->have_tsc)
		return -pte_bad_context;

	/* We shouldn't have more than one TMA per TSC. */
	if (time->have_tma)
		return -pte_bad_context;

	/* We're ignoring MTC between TSC and TMA. */
	if (time->have_mtc)
		return -pte_internal;

	ctc = packet->ctc;
	fc = packet->fc;

	mtc_freq = config->mtc_freq;
	mtc_hi = mtc_freq + pt_pl_mtc_bit_size;

	/* A mask for the relevant CTC bits ignoring high-order bits that are
	 * not provided by MTC.
	 */
	ctc_mask = (1u << mtc_hi) - 1u;

	time->have_tma = 1;
	time->base -= fc;
	time->fc += fc;

	/* If the MTC frequency is low enough that TMA provides the full CTC
	 * value, we can use the TMA as an MTC.
	 *
	 * If it isn't, we will estimate the preceding MTC based on the CTC bits
	 * the TMA provides at the next MTC.  We forget about the previous MTC
	 * in this case.
	 *
	 * If no MTC packets are dropped around TMA, we will estimate the
	 * forgotten value again at the next MTC.
	 *
	 * If MTC packets are dropped, we can't really tell where in this
	 * extended MTC period the TSC occurred.  The estimation will place it
	 * right before the next MTC.
	 */
	if (mtc_hi <= pt_pl_tma_ctc_bit_size)
		time->have_mtc = 1;

	/* In both cases, we store the TMA's CTC bits until the next MTC. */
	time->ctc = time->ctc_cyc = ctc & ctc_mask;

	return 0;
}